

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-handle-fileno.c
# Opt level: O1

int run_test_handle_fileno(void)

{
  int iVar1;
  int extraout_EAX;
  uv_loop_t *loop;
  uv_tty_t *stream;
  int64_t eval_b_13;
  uv_os_fd_t fd;
  int64_t eval_b_18;
  uv_tty_t tty;
  uv_pipe_t pipe;
  sockaddr_in addr;
  uv_idle_t idle;
  uv_udp_t udp;
  uv_tcp_t tcp;
  undefined1 local_420 [16];
  void *local_410;
  uv_tty_t local_408;
  uv_pipe_t local_2f0;
  sockaddr_in local_208;
  uv_idle_t local_1f8;
  uv_udp_t local_1a0;
  uv_tcp_t local_e8;
  
  loop = uv_default_loop();
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&local_208);
  local_408.data = (void *)(long)iVar1;
  local_2f0.data = (void *)0x0;
  if ((uv_close_cb)local_408.data == (uv_close_cb)0x0) {
    iVar1 = uv_idle_init(loop,&local_1f8);
    local_408.data = (void *)(long)iVar1;
    local_2f0.data = (void *)0x0;
    if ((uv_close_cb)local_408.data != (uv_close_cb)0x0) goto LAB_0019bbc2;
    iVar1 = uv_fileno((uv_handle_t *)&local_1f8,(uv_os_fd_t *)(local_420 + 0xc));
    local_408.data = (void *)(long)iVar1;
    local_2f0.data = (void *)0xffffffffffffffea;
    if ((uv_close_cb)local_408.data != (uv_close_cb)0xffffffffffffffea) goto LAB_0019bbd4;
    uv_close((uv_handle_t *)&local_1f8,(uv_close_cb)0x0);
    iVar1 = uv_tcp_init(loop,&local_e8);
    local_408.data = (void *)(long)iVar1;
    local_2f0.data = (void *)0x0;
    if ((uv_close_cb)local_408.data != (uv_close_cb)0x0) goto LAB_0019bbe6;
    iVar1 = uv_fileno((uv_handle_t *)&local_e8,(uv_os_fd_t *)(local_420 + 0xc));
    local_408.data = (void *)(long)iVar1;
    local_2f0.data = (void *)0xfffffffffffffff7;
    if ((uv_close_cb)local_408.data != (uv_close_cb)0xfffffffffffffff7) goto LAB_0019bbf8;
    iVar1 = uv_tcp_bind(&local_e8,(sockaddr *)&local_208,0);
    local_408.data = (void *)(long)iVar1;
    local_2f0.data = (void *)0x0;
    if ((uv_close_cb)local_408.data != (uv_close_cb)0x0) goto LAB_0019bc0a;
    iVar1 = uv_fileno((uv_handle_t *)&local_e8,(uv_os_fd_t *)(local_420 + 0xc));
    local_408.data = (void *)(long)iVar1;
    local_2f0.data = (void *)0x0;
    if ((uv_close_cb)local_408.data != (uv_close_cb)0x0) goto LAB_0019bc1c;
    uv_close((uv_handle_t *)&local_e8,(uv_close_cb)0x0);
    iVar1 = uv_fileno((uv_handle_t *)&local_e8,(uv_os_fd_t *)(local_420 + 0xc));
    local_408.data = (void *)(long)iVar1;
    local_2f0.data = (void *)0xfffffffffffffff7;
    if ((uv_close_cb)local_408.data != (uv_close_cb)0xfffffffffffffff7) goto LAB_0019bc2e;
    iVar1 = uv_udp_init(loop,&local_1a0);
    local_408.data = (void *)(long)iVar1;
    local_2f0.data = (void *)0x0;
    if ((uv_close_cb)local_408.data != (uv_close_cb)0x0) goto LAB_0019bc40;
    iVar1 = uv_fileno((uv_handle_t *)&local_1a0,(uv_os_fd_t *)(local_420 + 0xc));
    local_408.data = (void *)(long)iVar1;
    local_2f0.data = (void *)0xfffffffffffffff7;
    if ((uv_close_cb)local_408.data != (uv_close_cb)0xfffffffffffffff7) goto LAB_0019bc52;
    iVar1 = uv_udp_bind(&local_1a0,(sockaddr *)&local_208,0);
    local_408.data = (void *)(long)iVar1;
    local_2f0.data = (void *)0x0;
    if ((uv_close_cb)local_408.data != (uv_close_cb)0x0) goto LAB_0019bc64;
    iVar1 = uv_fileno((uv_handle_t *)&local_1a0,(uv_os_fd_t *)(local_420 + 0xc));
    local_408.data = (void *)(long)iVar1;
    local_2f0.data = (void *)0x0;
    if ((uv_close_cb)local_408.data != (uv_close_cb)0x0) goto LAB_0019bc76;
    uv_close((uv_handle_t *)&local_1a0,(uv_close_cb)0x0);
    iVar1 = uv_fileno((uv_handle_t *)&local_1a0,(uv_os_fd_t *)(local_420 + 0xc));
    local_408.data = (void *)(long)iVar1;
    local_2f0.data = (void *)0xfffffffffffffff7;
    if ((uv_close_cb)local_408.data != (uv_close_cb)0xfffffffffffffff7) goto LAB_0019bc88;
    iVar1 = uv_pipe_init(loop,&local_2f0,0);
    local_408.data = (void *)(long)iVar1;
    local_420._0_8_ = (void *)0x0;
    if ((uv_close_cb)local_408.data != (uv_close_cb)0x0) goto LAB_0019bc9a;
    iVar1 = uv_fileno((uv_handle_t *)&local_2f0,(uv_os_fd_t *)(local_420 + 0xc));
    local_408.data = (void *)(long)iVar1;
    local_420._0_8_ = (void *)0xfffffffffffffff7;
    if ((uv_close_cb)local_408.data != (uv_close_cb)0xfffffffffffffff7) goto LAB_0019bca9;
    iVar1 = uv_pipe_bind(&local_2f0,"/tmp/uv-test-sock");
    local_408.data = (void *)(long)iVar1;
    local_420._0_8_ = (void *)0x0;
    if ((uv_close_cb)local_408.data != (uv_close_cb)0x0) goto LAB_0019bcb8;
    iVar1 = uv_fileno((uv_handle_t *)&local_2f0,(uv_os_fd_t *)(local_420 + 0xc));
    local_408.data = (void *)(long)iVar1;
    local_420._0_8_ = (void *)0x0;
    if ((uv_close_cb)local_408.data != (uv_close_cb)0x0) goto LAB_0019bcc7;
    uv_close((uv_handle_t *)&local_2f0,(uv_close_cb)0x0);
    iVar1 = uv_fileno((uv_handle_t *)&local_2f0,(uv_os_fd_t *)(local_420 + 0xc));
    local_408.data = (void *)(long)iVar1;
    local_420._0_8_ = (void *)0xfffffffffffffff7;
    if ((uv_close_cb)local_408.data != (uv_close_cb)0xfffffffffffffff7) goto LAB_0019bcd6;
    iVar1 = open64("/dev/tty",0,0);
    if (iVar1 == -1) {
      run_test_handle_fileno_cold_26();
LAB_0019bb4a:
      uv_run(loop,UV_RUN_DEFAULT);
      uv_walk(loop,close_walk_cb,(void *)0x0);
      uv_run(loop,UV_RUN_DEFAULT);
      local_420._0_8_ = (void *)0x0;
      iVar1 = uv_loop_close(loop);
      local_410 = (void *)(long)iVar1;
      if ((void *)local_420._0_8_ == local_410) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_0019bce5;
    }
    iVar1 = uv_tty_init(loop,&local_408,iVar1,0);
    local_420._0_8_ = SEXT48(iVar1);
    local_410 = (void *)0x0;
    if ((void *)local_420._0_8_ != (void *)0x0) goto LAB_0019bcf4;
    iVar1 = uv_is_readable((uv_stream_t *)&local_408);
    if (iVar1 == 0) goto LAB_0019bd03;
    iVar1 = uv_is_writable((uv_stream_t *)&local_408);
    if (iVar1 != 0) goto LAB_0019bd08;
    iVar1 = uv_fileno((uv_handle_t *)&local_408,(uv_os_fd_t *)(local_420 + 0xc));
    local_420._0_8_ = SEXT48(iVar1);
    local_410 = (void *)0x0;
    if ((void *)local_420._0_8_ != (void *)0x0) goto LAB_0019bd0d;
    uv_close((uv_handle_t *)&local_408,(uv_close_cb)0x0);
    iVar1 = uv_fileno((uv_handle_t *)&local_408,(uv_os_fd_t *)(local_420 + 0xc));
    local_420._0_8_ = SEXT48(iVar1);
    local_410 = (void *)0xfffffffffffffff7;
    if ((void *)local_420._0_8_ != (void *)0xfffffffffffffff7) goto LAB_0019bd1c;
    stream = &local_408;
    iVar1 = uv_is_readable((uv_stream_t *)stream);
    if (iVar1 == 0) {
      stream = &local_408;
      iVar1 = uv_is_writable((uv_stream_t *)stream);
      if (iVar1 != 0) goto LAB_0019bd30;
      goto LAB_0019bb4a;
    }
  }
  else {
    run_test_handle_fileno_cold_1();
LAB_0019bbc2:
    run_test_handle_fileno_cold_2();
LAB_0019bbd4:
    run_test_handle_fileno_cold_3();
LAB_0019bbe6:
    run_test_handle_fileno_cold_4();
LAB_0019bbf8:
    run_test_handle_fileno_cold_5();
LAB_0019bc0a:
    run_test_handle_fileno_cold_6();
LAB_0019bc1c:
    run_test_handle_fileno_cold_7();
LAB_0019bc2e:
    run_test_handle_fileno_cold_8();
LAB_0019bc40:
    run_test_handle_fileno_cold_9();
LAB_0019bc52:
    run_test_handle_fileno_cold_10();
LAB_0019bc64:
    run_test_handle_fileno_cold_11();
LAB_0019bc76:
    run_test_handle_fileno_cold_12();
LAB_0019bc88:
    run_test_handle_fileno_cold_13();
LAB_0019bc9a:
    run_test_handle_fileno_cold_14();
LAB_0019bca9:
    run_test_handle_fileno_cold_15();
LAB_0019bcb8:
    run_test_handle_fileno_cold_16();
LAB_0019bcc7:
    run_test_handle_fileno_cold_17();
LAB_0019bcd6:
    run_test_handle_fileno_cold_18();
LAB_0019bce5:
    run_test_handle_fileno_cold_27();
LAB_0019bcf4:
    run_test_handle_fileno_cold_19();
LAB_0019bd03:
    run_test_handle_fileno_cold_25();
LAB_0019bd08:
    run_test_handle_fileno_cold_20();
LAB_0019bd0d:
    run_test_handle_fileno_cold_21();
LAB_0019bd1c:
    stream = (uv_tty_t *)local_420;
    run_test_handle_fileno_cold_22();
  }
  run_test_handle_fileno_cold_23();
LAB_0019bd30:
  run_test_handle_fileno_cold_24();
  iVar1 = uv_is_closing((uv_handle_t *)stream);
  if (iVar1 != 0) {
    return iVar1;
  }
  uv_close((uv_handle_t *)stream,(uv_close_cb)0x0);
  return extraout_EAX;
}

Assistant:

TEST_IMPL(handle_fileno) {
  int r;
  uv_os_fd_t tty_fd;
  struct sockaddr_in addr;
  uv_os_fd_t fd;
  uv_tcp_t tcp;
  uv_udp_t udp;
  uv_pipe_t pipe;
  uv_tty_t tty;
  uv_idle_t idle;
  uv_loop_t* loop;

  loop = uv_default_loop();
  ASSERT_OK(uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));

  r = uv_idle_init(loop, &idle);
  ASSERT_OK(r);
  r = uv_fileno((uv_handle_t*) &idle, &fd);
  ASSERT_EQ(r, UV_EINVAL);
  uv_close((uv_handle_t*) &idle, NULL);

  r = uv_tcp_init(loop, &tcp);
  ASSERT_OK(r);
  r = uv_fileno((uv_handle_t*) &tcp, &fd);
  ASSERT_EQ(r, UV_EBADF);
  r = uv_tcp_bind(&tcp, (const struct sockaddr*) &addr, 0);
  ASSERT_OK(r);
  r = uv_fileno((uv_handle_t*) &tcp, &fd);
  ASSERT_OK(r);
  uv_close((uv_handle_t*) &tcp, NULL);
  r = uv_fileno((uv_handle_t*) &tcp, &fd);
  ASSERT_EQ(r, UV_EBADF);

  r = uv_udp_init(loop, &udp);
  ASSERT_OK(r);
  r = uv_fileno((uv_handle_t*) &udp, &fd);
  ASSERT_EQ(r, UV_EBADF);
  r = uv_udp_bind(&udp, (const struct sockaddr*) &addr, 0);
  ASSERT_OK(r);
  r = uv_fileno((uv_handle_t*) &udp, &fd);
  ASSERT_OK(r);
  uv_close((uv_handle_t*) &udp, NULL);
  r = uv_fileno((uv_handle_t*) &udp, &fd);
  ASSERT_EQ(r, UV_EBADF);

  r = uv_pipe_init(loop, &pipe, 0);
  ASSERT_OK(r);
  r = uv_fileno((uv_handle_t*) &pipe, &fd);
  ASSERT_EQ(r, UV_EBADF);
  r = uv_pipe_bind(&pipe, TEST_PIPENAME);
  ASSERT_OK(r);
  r = uv_fileno((uv_handle_t*) &pipe, &fd);
  ASSERT_OK(r);
  uv_close((uv_handle_t*) &pipe, NULL);
  r = uv_fileno((uv_handle_t*) &pipe, &fd);
  ASSERT_EQ(r, UV_EBADF);

  tty_fd = get_tty_fd();
  if (tty_fd == (uv_os_fd_t)-1) {
    fprintf(stderr, "Cannot open a TTY fd");
    fflush(stderr);
  } else {
    r = uv_tty_init(loop, &tty, tty_fd, 0);
    ASSERT_OK(r);
    ASSERT(uv_is_readable((uv_stream_t*) &tty));
    ASSERT(!uv_is_writable((uv_stream_t*) &tty));
    r = uv_fileno((uv_handle_t*) &tty, &fd);
    ASSERT_OK(r);
    uv_close((uv_handle_t*) &tty, NULL);
    r = uv_fileno((uv_handle_t*) &tty, &fd);
    ASSERT_EQ(r, UV_EBADF);
    ASSERT(!uv_is_readable((uv_stream_t*) &tty));
    ASSERT(!uv_is_writable((uv_stream_t*) &tty));
  }

  uv_run(loop, UV_RUN_DEFAULT);

  MAKE_VALGRIND_HAPPY(loop);
  return 0;
}